

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_popup_close(nk_context *ctx)

{
  nk_window *popup;
  nk_context *ctx_local;
  
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    ctx->current->flags = ctx->current->flags | 0x2000;
  }
  return;
}

Assistant:

NK_API void
nk_popup_close(struct nk_context *ctx)
{
struct nk_window *popup;
NK_ASSERT(ctx);
if (!ctx || !ctx->current) return;

popup = ctx->current;
NK_ASSERT(popup->parent);
NK_ASSERT(popup->layout->type & NK_PANEL_SET_POPUP);
popup->flags |= NK_WINDOW_HIDDEN;
}